

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_close.c
# Opt level: O3

int add_data(zip_t *za,zip_source_t *src,zip_dirent_t *de,zip_uint32_t changed)

{
  zip_uint16_t zVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  zip_int64_t zVar6;
  zip_encryption_implementation p_Var7;
  zip_source_t *pzVar8;
  zip_source_t *src_00;
  zip_uint64_t length;
  zip_int64_t offset;
  uint uVar9;
  short sVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  zip_flags_t flags;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  double dVar18;
  zip_stat_t st;
  zip_file_attributes_t attributes;
  long local_20a8;
  zip_stat_t local_2088;
  ulong local_2048;
  zip_int64_t local_2040;
  zip_file_attributes_t local_2038 [341];
  
  iVar2 = zip_source_stat(src,&local_2088);
  if (iVar2 < 0) goto LAB_001059d2;
  if ((local_2088.valid & 0x40) == 0) {
    local_2088.valid = local_2088.valid | 0x40;
    local_2088.comp_method = 0;
  }
  uVar9 = de->comp_method;
  if (uVar9 == 0xffffffff) {
    if (local_2088.comp_method != 0) goto LAB_001055e6;
LAB_001055ef:
    local_2088.valid = (zip_uint64_t)((uint)local_2088.valid & 0xfffffff7);
  }
  else if (uVar9 == 0xfffffffe && local_2088.comp_method != 0) {
LAB_001055e6:
    uVar9 = (uint)local_2088.comp_method;
    de->comp_method = uVar9;
  }
  else {
    if ((uVar9 != 0) || ((local_2088.valid & 4) == 0)) goto LAB_001055ef;
    local_2088.valid = local_2088.valid | 8;
    local_2088.comp_size = local_2088.size;
    uVar9 = 0;
  }
  if (-1 < (char)local_2088.valid) {
    local_2088.valid = local_2088.valid | 0x80;
    local_2088.encryption_method = 0;
  }
  if ((local_2088.valid & 4) == 0) {
    flags = 0x500;
    uVar11 = 0xffffffffffffffff;
  }
  else {
    de->uncomp_size = local_2088.size;
    uVar11 = local_2088.size;
    if ((local_2088.valid & 8) == 0) {
      uVar5 = 0xfe792114;
      sVar10 = 8;
      if (uVar9 < 0xfffffffe) {
        sVar10 = (short)uVar9;
      }
      if (sVar10 == 0) {
        uVar5 = 0xffffffff;
      }
      else if (sVar10 != 0xc) {
        if (sVar10 == 8) {
          uVar5 = 0xffec0183;
        }
        else {
          uVar5 = 0;
        }
      }
      flags = (uint)(uVar5 < local_2088.size) << 10 | 0x100;
    }
    else {
      de->comp_size = local_2088.comp_size;
      flags = 0x100;
    }
  }
  zVar6 = zip_source_tell_write(za->src);
  if (-1 < zVar6) {
    *(byte *)&de->bitflags = (byte)de->bitflags & 0xf7;
    local_2048 = uVar11;
    local_2040 = zVar6;
    iVar2 = _zip_dirent_write(za,de,flags);
    zVar1 = local_2088.encryption_method;
    if (iVar2 < 0) {
      return -1;
    }
    bVar14 = local_2088.comp_method == 0;
    uVar9 = de->comp_method;
    uVar13 = 8;
    if (uVar9 < 0xfffffffe) {
      uVar13 = uVar9 & 0xffff;
    }
    bVar15 = uVar13 == local_2088.comp_method;
    if (!bVar15) {
      bVar16 = uVar9 != 0;
LAB_00105737:
      bVar17 = de->encryption_method != 0;
      zip_source_keep(src);
      pzVar8 = src;
      if (zVar1 == 0) {
LAB_00105795:
        src = pzVar8;
        if (bVar14 || bVar15) goto LAB_001057eb;
        src_00 = zip_source_decompress(za,pzVar8,(uint)local_2088.comp_method);
        zip_source_free(pzVar8);
        if (src_00 == (zip_source_t *)0x0) {
          return -1;
        }
        goto LAB_001057f1;
      }
LAB_00105756:
      p_Var7 = _zip_get_encryption_implementation(local_2088.encryption_method,0);
      if (p_Var7 != (zip_encryption_implementation)0x0) {
        pzVar8 = (*p_Var7)(za,src,local_2088.encryption_method,0,za->default_password);
        zip_source_free(src);
        if (pzVar8 == (zip_source_t *)0x0) {
          return -1;
        }
        goto LAB_00105795;
      }
LAB_001059f0:
      zip_error_set(&za->error,0x18,0);
LAB_00105a03:
      zip_source_free(src);
      return -1;
    }
    if ((de->changed & 0x80) != 0) {
      bVar16 = false;
      goto LAB_00105737;
    }
    if (de->encryption_method != local_2088.encryption_method) {
      bVar17 = de->encryption_method != 0;
      zip_source_keep(src);
      bVar16 = false;
      if (zVar1 == 0) goto LAB_001057e7;
      goto LAB_00105756;
    }
    zip_source_keep(src);
    bVar17 = false;
LAB_001057e7:
    bVar16 = false;
LAB_001057eb:
    src_00 = src;
    if (bVar14 || !bVar15) {
LAB_001057f1:
      src = zip_source_crc(za,src_00,0);
      zip_source_free(src_00);
      if (src == (zip_source_t *)0x0) {
        return -1;
      }
    }
    if (bVar16) {
      pzVar8 = zip_source_compress(za,src,de->comp_method,(uint)de->compression_level);
      zip_source_free(src);
      src = pzVar8;
      if (pzVar8 == (zip_source_t *)0x0) {
        return -1;
      }
    }
    if (bVar17) {
      pcVar12 = de->password;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = za->default_password;
      }
      p_Var7 = _zip_get_encryption_implementation(de->encryption_method,1);
      if (p_Var7 == (zip_encryption_implementation)0x0) goto LAB_001059f0;
      pzVar8 = (*p_Var7)(za,src,de->encryption_method,1,pcVar12);
      if (pzVar8 == (zip_source_t *)0x0) goto LAB_00105a03;
      if (de->encryption_method == 1) {
        *(byte *)&de->bitflags = (byte)de->bitflags | 8;
      }
      zip_source_free(src);
      src = pzVar8;
    }
    zVar6 = zip_source_tell_write(za->src);
    if (-1 < zVar6) {
      iVar3 = zip_source_open(src);
      if (iVar3 < 0) {
        _zip_error_set_from_source(&za->error,src);
        iVar3 = -1;
      }
      else {
        length = zip_source_read(src,local_2038,0x2000);
        if (0 < (long)length) {
          dVar18 = (double)(long)local_2048;
          local_20a8 = 0;
          do {
            iVar4 = _zip_write(za,local_2038,length);
            iVar3 = -1;
            if (iVar4 < 0) goto LAB_00105a31;
            if ((length == 0x2000) &&
               (za->progress != (zip_progress_t *)0x0 && 0 < (long)local_2048)) {
              local_20a8 = local_20a8 + 0x2000;
              iVar4 = _zip_progress_update(za->progress,(double)local_20a8 / dVar18);
              if (iVar4 != 0) {
                zip_error_set(&za->error,0x20,0);
                goto LAB_00105a31;
              }
            }
            length = zip_source_read(src,local_2038,0x2000);
          } while (0 < (long)length);
        }
        iVar3 = 0;
        if ((long)length < 0) {
          _zip_error_set_from_source(&za->error,src);
          iVar3 = -1;
        }
LAB_00105a31:
        zip_source_close(src);
      }
      iVar4 = zip_source_stat(src,&local_2088);
      if (iVar4 < 0) {
        _zip_error_set_from_source(&za->error,src);
        iVar3 = -1;
      }
      iVar4 = zip_source_get_file_attributes(src,local_2038);
      if (iVar4 != 0) {
        _zip_error_set_from_source(&za->error,src);
        zip_source_free(src);
        return -1;
      }
      zip_source_free(src);
      if (iVar3 < 0) {
        return -1;
      }
      offset = zip_source_tell_write(za->src);
      if ((-1 < offset) && (iVar3 = zip_source_seek_write(za->src,local_2040,0), -1 < iVar3)) {
        if ((~(uint)local_2088.valid & 100) == 0) {
          if ((de->changed & 0x20) == 0) {
            if ((local_2088.valid & 0x10) == 0) {
              time(&de->last_mod);
            }
            else {
              de->last_mod = local_2088.mtime;
            }
          }
          de->comp_method = (uint)local_2088.comp_method;
          de->crc = local_2088.crc;
          de->uncomp_size = local_2088.size;
          de->comp_size = offset - zVar6;
          _zip_dirent_apply_attributes(de,local_2038,0x3ff < flags,changed);
          iVar3 = _zip_dirent_write(za,de,flags);
          if (iVar3 < 0) {
            return -1;
          }
          if (iVar2 == iVar3) {
            iVar3 = zip_source_seek_write(za->src,offset,0);
            if (-1 < iVar3) {
              if (((de->bitflags & 8) != 0) &&
                 (iVar2 = write_data_descriptor(za,de,iVar2), iVar2 < 0)) {
                return -1;
              }
              return 0;
            }
            goto LAB_00105b9e;
          }
        }
        zip_error_set(&za->error,0x14,0);
        return -1;
      }
LAB_00105b9e:
      _zip_error_set_from_source(&za->error,za->src);
      return -1;
    }
  }
  src = za->src;
LAB_001059d2:
  _zip_error_set_from_source(&za->error,src);
  return -1;
}

Assistant:

static int
add_data(zip_t *za, zip_source_t *src, zip_dirent_t *de, zip_uint32_t changed) {
    zip_int64_t offstart, offdata, offend, data_length;
    zip_stat_t st;
    zip_file_attributes_t attributes;
    zip_source_t *src_final, *src_tmp;
    int ret;
    int is_zip64;
    zip_flags_t flags;
    bool needs_recompress, needs_decompress, needs_crc, needs_compress, needs_reencrypt, needs_decrypt, needs_encrypt;

    if (zip_source_stat(src, &st) < 0) {
	_zip_error_set_from_source(&za->error, src);
	return -1;
    }

    if ((st.valid & ZIP_STAT_COMP_METHOD) == 0) {
	st.valid |= ZIP_STAT_COMP_METHOD;
	st.comp_method = ZIP_CM_STORE;
    }

    if (ZIP_CM_IS_DEFAULT(de->comp_method) && st.comp_method != ZIP_CM_STORE)
	de->comp_method = st.comp_method;
    else if (de->comp_method == ZIP_CM_STORE && (st.valid & ZIP_STAT_SIZE)) {
	st.valid |= ZIP_STAT_COMP_SIZE;
	st.comp_size = st.size;
    }
    else {
	/* we'll recompress */
	st.valid &= ~ZIP_STAT_COMP_SIZE;
    }

    if ((st.valid & ZIP_STAT_ENCRYPTION_METHOD) == 0) {
	st.valid |= ZIP_STAT_ENCRYPTION_METHOD;
	st.encryption_method = ZIP_EM_NONE;
    }

    flags = ZIP_EF_LOCAL;

    if ((st.valid & ZIP_STAT_SIZE) == 0) {
	flags |= ZIP_FL_FORCE_ZIP64;
	data_length = -1;
    }
    else {
	de->uncomp_size = st.size;
	/* this is technically incorrect (copy_source counts compressed data), but it's the best we have */
	data_length = (zip_int64_t)st.size;

	if ((st.valid & ZIP_STAT_COMP_SIZE) == 0) {
	    zip_uint64_t max_size;

	    switch (ZIP_CM_ACTUAL(de->comp_method)) {
	    case ZIP_CM_BZIP2:
		/* computed by looking at increase of 10 random files of size 1MB when
		 * compressed with bzip2, rounded up: 1.006 */
		max_size = 4269351188u;
		break;

	    case ZIP_CM_DEFLATE:
		/* max deflate size increase: size + ceil(size/16k)*5+6 */
		max_size = 4293656963u;
		break;

	    case ZIP_CM_STORE:
		max_size = 0xffffffffu;
		break;

	    default:
		max_size = 0;
	    }

	    if (st.size > max_size) {
		flags |= ZIP_FL_FORCE_ZIP64;
	    }
	}
	else
	    de->comp_size = st.comp_size;
    }

    if ((offstart = zip_source_tell_write(za->src)) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    /* as long as we don't support non-seekable output, clear data descriptor bit */
    de->bitflags &= (zip_uint16_t)~ZIP_GPBF_DATA_DESCRIPTOR;
    if ((is_zip64 = _zip_dirent_write(za, de, flags)) < 0) {
	return -1;
    }

    needs_recompress = st.comp_method != ZIP_CM_ACTUAL(de->comp_method);
    needs_decompress = needs_recompress && (st.comp_method != ZIP_CM_STORE);
    needs_crc = (st.comp_method == ZIP_CM_STORE) || needs_decompress;
    needs_compress = needs_recompress && (de->comp_method != ZIP_CM_STORE);

    needs_reencrypt = needs_recompress || (de->changed & ZIP_DIRENT_PASSWORD) || (de->encryption_method != st.encryption_method);
    needs_decrypt = needs_reencrypt && (st.encryption_method != ZIP_EM_NONE);
    needs_encrypt = needs_reencrypt && (de->encryption_method != ZIP_EM_NONE);

    src_final = src;
    zip_source_keep(src_final);

    if (needs_decrypt) {
	zip_encryption_implementation impl;

	if ((impl = _zip_get_encryption_implementation(st.encryption_method, ZIP_CODEC_DECODE)) == NULL) {
	    zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
	    zip_source_free(src_final);
	    return -1;
	}
	if ((src_tmp = impl(za, src_final, st.encryption_method, ZIP_CODEC_DECODE, za->default_password)) == NULL) {
	    /* error set by impl */
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }

    if (needs_decompress) {
	if ((src_tmp = zip_source_decompress(za, src_final, st.comp_method)) == NULL) {
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }

    if (needs_crc) {
	if ((src_tmp = zip_source_crc(za, src_final, 0)) == NULL) {
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }

    if (needs_compress) {
	if ((src_tmp = zip_source_compress(za, src_final, de->comp_method, de->compression_level)) == NULL) {
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }


    if (needs_encrypt) {
	zip_encryption_implementation impl;
	const char *password = NULL;

	if (de->password) {
	    password = de->password;
	}
	else if (za->default_password) {
	    password = za->default_password;
	}

	if ((impl = _zip_get_encryption_implementation(de->encryption_method, ZIP_CODEC_ENCODE)) == NULL) {
	    zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
	    zip_source_free(src_final);
	    return -1;
	}
	if ((src_tmp = impl(za, src_final, de->encryption_method, ZIP_CODEC_ENCODE, password)) == NULL) {
	    /* error set by impl */
	    zip_source_free(src_final);
	    return -1;
	}
	if (de->encryption_method == ZIP_EM_TRAD_PKWARE) {
	    de->bitflags |= ZIP_GPBF_DATA_DESCRIPTOR;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }


    if ((offdata = zip_source_tell_write(za->src)) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    ret = copy_source(za, src_final, data_length);

    if (zip_source_stat(src_final, &st) < 0) {
	_zip_error_set_from_source(&za->error, src_final);
	ret = -1;
    }

    if (zip_source_get_file_attributes(src_final, &attributes) != 0) {
	_zip_error_set_from_source(&za->error, src_final);
	ret = -1;
    }

    zip_source_free(src_final);

    if (ret < 0) {
	return -1;
    }

    if ((offend = zip_source_tell_write(za->src)) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    if (zip_source_seek_write(za->src, offstart, SEEK_SET) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    if ((st.valid & (ZIP_STAT_COMP_METHOD | ZIP_STAT_CRC | ZIP_STAT_SIZE)) != (ZIP_STAT_COMP_METHOD | ZIP_STAT_CRC | ZIP_STAT_SIZE)) {
	zip_error_set(&za->error, ZIP_ER_INTERNAL, 0);
	return -1;
    }

    if ((de->changed & ZIP_DIRENT_LAST_MOD) == 0) {
	if (st.valid & ZIP_STAT_MTIME)
	    de->last_mod = st.mtime;
	else
	    time(&de->last_mod);
    }
    de->comp_method = st.comp_method;
    de->crc = st.crc;
    de->uncomp_size = st.size;
    de->comp_size = (zip_uint64_t)(offend - offdata);
    _zip_dirent_apply_attributes(de, &attributes, (flags & ZIP_FL_FORCE_ZIP64) != 0, changed);

    if ((ret = _zip_dirent_write(za, de, flags)) < 0)
	return -1;

    if (is_zip64 != ret) {
	/* Zip64 mismatch between preliminary file header written before data and final file header written afterwards */
	zip_error_set(&za->error, ZIP_ER_INTERNAL, 0);
	return -1;
    }

    if (zip_source_seek_write(za->src, offend, SEEK_SET) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    if (de->bitflags & ZIP_GPBF_DATA_DESCRIPTOR) {
	if (write_data_descriptor(za, de, is_zip64) < 0) {
	    return -1;
	}
    }

    return 0;
}